

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

DatePartSpecifier duckdb::GetDateTypePartSpecifier(string *specifier,LogicalType *type)

{
  LogicalTypeId LVar1;
  DatePartSpecifier DVar2;
  NotImplementedException *this;
  uint uVar3;
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  DVar2 = GetDatePartSpecifier(specifier);
  LVar1 = type->id_;
  if ((LVar1 == TIME_TZ) || (LVar1 == TIME)) {
    if (BEGIN_DOUBLE < DVar2) goto LAB_01c7121f;
    uVar3 = 0x7807c0;
  }
  else {
    if (LVar1 == TIMESTAMP) {
      return DVar2;
    }
    if (LVar1 == INTERVAL) {
      if (BEGIN_DOUBLE < DVar2) goto LAB_01c7121f;
      uVar3 = 0x4087ff;
    }
    else {
      if (LVar1 == TIMESTAMP_TZ) {
        return DVar2;
      }
      if ((LVar1 != DATE) || (JULIAN_DAY < DVar2)) goto LAB_01c7121f;
      uVar3 = 0xc7f83f;
    }
  }
  if ((uVar3 >> (DVar2 & 0x1f) & 1) != 0) {
    return DVar2;
  }
LAB_01c7121f:
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_40,"\"%s\" units \"%s\" not recognized",&local_81)
  ;
  EnumUtil::ToString<duckdb::LogicalTypeId>(&local_60,type->id_);
  ::std::__cxx11::string::string((string *)&local_80,(string *)specifier);
  NotImplementedException::NotImplementedException<std::__cxx11::string,std::__cxx11::string>
            (this,&local_40,&local_60,&local_80);
  __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

DatePartSpecifier GetDateTypePartSpecifier(const string &specifier, LogicalType &type) {
	const auto part = GetDatePartSpecifier(specifier);
	switch (type.id()) {
	case LogicalType::TIMESTAMP:
	case LogicalType::TIMESTAMP_TZ:
		return part;
	case LogicalType::DATE:
		switch (part) {
		case DatePartSpecifier::YEAR:
		case DatePartSpecifier::MONTH:
		case DatePartSpecifier::DAY:
		case DatePartSpecifier::DECADE:
		case DatePartSpecifier::CENTURY:
		case DatePartSpecifier::MILLENNIUM:
		case DatePartSpecifier::DOW:
		case DatePartSpecifier::ISODOW:
		case DatePartSpecifier::ISOYEAR:
		case DatePartSpecifier::WEEK:
		case DatePartSpecifier::QUARTER:
		case DatePartSpecifier::DOY:
		case DatePartSpecifier::YEARWEEK:
		case DatePartSpecifier::ERA:
		case DatePartSpecifier::EPOCH:
		case DatePartSpecifier::JULIAN_DAY:
			return part;
		default:
			break;
		}
		break;
	case LogicalType::TIME:
	case LogicalType::TIME_TZ:
		switch (part) {
		case DatePartSpecifier::MICROSECONDS:
		case DatePartSpecifier::MILLISECONDS:
		case DatePartSpecifier::SECOND:
		case DatePartSpecifier::MINUTE:
		case DatePartSpecifier::HOUR:
		case DatePartSpecifier::EPOCH:
		case DatePartSpecifier::TIMEZONE:
		case DatePartSpecifier::TIMEZONE_HOUR:
		case DatePartSpecifier::TIMEZONE_MINUTE:
			return part;
		default:
			break;
		}
		break;
	case LogicalType::INTERVAL:
		switch (part) {
		case DatePartSpecifier::YEAR:
		case DatePartSpecifier::MONTH:
		case DatePartSpecifier::DAY:
		case DatePartSpecifier::DECADE:
		case DatePartSpecifier::CENTURY:
		case DatePartSpecifier::QUARTER:
		case DatePartSpecifier::MILLENNIUM:
		case DatePartSpecifier::MICROSECONDS:
		case DatePartSpecifier::MILLISECONDS:
		case DatePartSpecifier::SECOND:
		case DatePartSpecifier::MINUTE:
		case DatePartSpecifier::HOUR:
		case DatePartSpecifier::EPOCH:
			return part;
		default:
			break;
		}
		break;
	default:
		break;
	}

	throw NotImplementedException("\"%s\" units \"%s\" not recognized", EnumUtil::ToString(type.id()), specifier);
}